

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skills.c
# Opt level: O1

void check_style_improve(CHAR_DATA *ch,int style,int multiplier)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  char *pcVar6;
  char *pcVar7;
  short sVar8;
  short sVar9;
  long lVar10;
  char test [4608];
  char local_1238 [4616];
  
  if (style < 100 && style != 0) {
    iVar3 = skill_lookup(style_table[style].name);
    iVar4 = get_curr_stat(ch,1);
    sVar9 = int_app[iVar4].learn;
    sVar8 = ch->level;
    iVar4 = number_range(1,1000);
    if (iVar4 <= (sVar9 * 10) / (multiplier << 2) + sVar8 * 2) {
      sVar8 = ch->pcdata->learned[iVar3] + 1;
      sVar9 = 100;
      if (sVar8 < 100) {
        sVar9 = sVar8;
      }
      ch->pcdata->learned[iVar3] = sVar9;
      lVar10 = 0;
      do {
        iVar4 = skill_lookup(*(char **)((long)&style_percent[0].name + lVar10));
        if ((((0 < iVar4) && (uVar5 = gn_skill_lookup(iVar4), 1 < (int)uVar5)) &&
            (bVar2 = str_prefix(group_table[uVar5].name,style_table[style].name), !bVar2)) &&
           (ch->pcdata->learned[iVar3] == *(short *)((long)&style_percent[0].percent + lVar10))) {
          pcVar6 = get_char_color(ch,"lightyellow");
          pcVar1 = style_table[style].name;
          pcVar7 = END_COLOR(ch);
          sprintf(local_1238,"%sYou make a breakthrough in your understanding of the %s style!%s",
                  pcVar6,pcVar1,pcVar7);
          act(local_1238,ch,(void *)0x0,(void *)0x0,3);
          sprintf(local_1238,"You feel ready to learn the %s skill.",
                  *(undefined8 *)((long)&style_percent[0].name + lVar10));
          act(local_1238,ch,(void *)0x0,(void *)0x0,3);
        }
        lVar10 = lVar10 + 0x10;
      } while (lVar10 != 0x260);
    }
  }
  return;
}

Assistant:

void check_style_improve(CHAR_DATA *ch, int style, int multiplier)
{
	int chance, sn, skill, gn, i;
	char test[MSL];

	if (style == 0 || style >= 100)
		return;

	sn = skill_lookup(style_table[style].name);
	chance = 10 * int_app[get_curr_stat(ch, STAT_INT)].learn;
	chance /= (multiplier * 4);
	chance += ch->level * 2;

	if (number_range(1, 1000) > chance)
		return;

	ch->pcdata->learned[sn]++;

	if (ch->pcdata->learned[sn] > 100)
		ch->pcdata->learned[sn] = 100;

	/* check for newly learned style skills */
	for (i = 0; i < MAX_STYLE_SKILL; i++)
	{
		skill = skill_lookup(style_percent[i].name);

		if (skill > 0)
		{
			gn = gn_skill_lookup(skill);

			if (gn > 1)
			{
				if (!str_prefix(group_table[gn].name, style_table[style].name))
				{
					if (ch->pcdata->learned[sn] == style_percent[i].percent)
					{
						sprintf(test, "%sYou make a breakthrough in your understanding of the %s style!%s",
							get_char_color(ch, "lightyellow"),
							style_table[style].name,
							END_COLOR(ch));
						act(test, ch, 0, 0, TO_CHAR);

						sprintf(test, "You feel ready to learn the %s skill.", style_percent[i].name);
						act(test, ch, 0, 0, TO_CHAR);
					}
				}
			}
		}
	}
}